

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS
ref_phys_euler_dual_flux(REF_GRID ref_grid,REF_INT ldim,REF_DBL *primitive_dual,REF_DBL *dual_flux)

{
  REF_NODE pRVar1;
  ulong uVar2;
  REF_DBL *pRVar3;
  long lVar4;
  REF_DBL *pRVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  char *pcVar9;
  REF_DBL *local_d0;
  REF_DBL local_a8 [4];
  REF_DBL flux [5];
  REF_DBL state [5];
  
  if ((ldim & 1U) == 0) {
    if (9 < ldim) {
      pRVar1 = ref_grid->node;
      uVar2 = 0;
      uVar8 = (ulong)(uint)pRVar1->max;
      if (pRVar1->max < 1) {
        uVar8 = uVar2;
      }
      pRVar3 = primitive_dual + ((uint)ldim >> 1);
      pRVar5 = dual_flux;
      for (; uVar2 != uVar8; uVar2 = uVar2 + 1) {
        if (-1 < pRVar1->global[uVar2]) {
          for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
            pRVar5[lVar7] = pRVar3[lVar7];
          }
        }
        pRVar5 = pRVar5 + 0x14;
        pRVar3 = pRVar3 + (uint)ldim;
      }
      pRVar3 = dual_flux + 5;
      for (uVar2 = 0; uVar2 != uVar8; uVar2 = uVar2 + 1) {
        if (-1 < pRVar1->global[uVar2]) {
          for (lVar7 = 0; lVar7 != 0xf; lVar7 = lVar7 + 1) {
            pRVar3[lVar7] = 0.0;
          }
        }
        pRVar3 = pRVar3 + 0x14;
      }
      local_d0 = dual_flux + 5;
      for (uVar2 = 0; uVar2 != uVar8; uVar2 = uVar2 + 1) {
        if (-1 < pRVar1->global[uVar2]) {
          for (lVar7 = 0; lVar7 != 5; lVar7 = lVar7 + 1) {
            state[lVar7] = primitive_dual[lVar7];
          }
          pRVar3 = local_d0;
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            local_a8[0] = 0.0;
            local_a8[1] = 0.0;
            local_a8[2] = 0.0;
            local_a8[lVar7] = 1.0;
            ref_phys_euler(state,local_a8,flux);
            for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
              pRVar3[lVar4] = flux[lVar4] + pRVar3[lVar4];
            }
            pRVar3 = pRVar3 + 5;
          }
        }
        primitive_dual = primitive_dual + (uint)ldim;
        local_d0 = local_d0 + 0x14;
      }
      return 0;
    }
    pcVar9 = "expect ldim >= 10";
    uVar6 = 0x144;
  }
  else {
    pcVar9 = "expect even ldim";
    uVar6 = 0x143;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar6,
         "ref_phys_euler_dual_flux",pcVar9);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_phys_euler_dual_flux(REF_GRID ref_grid, REF_INT ldim,
                                            REF_DBL *primitive_dual,
                                            REF_DBL *dual_flux) {
  REF_INT i, node, dir, nvar;
  REF_DBL direction[3], state[5], flux[5];

  RAS(0 == ldim % 2, "expect even ldim");
  RAS(ldim >= 10, "expect ldim >= 10");
  nvar = ldim / 2;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 5; i++) {
      dual_flux[i + 20 * node] = primitive_dual[nvar + i + ldim * node];
    }
  }

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 15; i++) {
      dual_flux[5 + i + 20 * node] = 0.0;
    }
  }

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    for (i = 0; i < 5; i++) {
      state[i] = primitive_dual[i + ldim * node];
    }
    for (dir = 0; dir < 3; dir++) {
      direction[0] = 0;
      direction[1] = 0;
      direction[2] = 0;
      direction[dir] = 1;
      RSS(ref_phys_euler(state, direction, flux), "euler");
      for (i = 0; i < 5; i++) {
        dual_flux[i + 5 + 5 * dir + 20 * node] += flux[i];
      }
    }
  }
  return REF_SUCCESS;
}